

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,ScalarType *type,string_view param_3)

{
  string_view str;
  string_view str_00;
  long in_RSI;
  char *in_RDI;
  FormatBuffer *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *pcVar1;
  
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0xa6d3eb)
  ;
  pcVar1 = *(char **)(in_RSI + 8);
  str._M_str = pcVar1;
  str._M_len = in_stack_ffffffffffffffc8;
  FormatBuffer::append(in_stack_ffffffffffffffc0,str);
  if ((*(byte *)(in_RSI + 0x4c) & 1) != 0) {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xa6d42d);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,in_RDI)
    ;
    str_00._M_str = pcVar1;
    str_00._M_len = in_stack_ffffffffffffffc8;
    FormatBuffer::append(in_stack_ffffffffffffffc0,str_00);
  }
  return;
}

Assistant:

void TypePrinter::visit(const ScalarType& type, std::string_view) {
    buffer->append(type.name);
    if (type.isSigned)
        buffer->append(" signed");
}